

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O3

void Style::extractConditionalConstraint(TempConstraintData *tempConstraint,xml_node<char> *node)

{
  Quant QVar1;
  int iVar2;
  logic_error *plVar3;
  xml_node<char> *pxVar4;
  char *pcVar5;
  xml_node<char> *pxVar6;
  string attrVal;
  allocator<char> local_d5;
  Quant local_d4;
  reference local_d0;
  string local_c8;
  u16string local_a8;
  ConditionalConstraint local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pcVar5 = (node->super_xml_base<char>).m_name;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  iVar2 = strcmp(pcVar5,"bcf:constraint");
  if (iVar2 != 0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"Unexpected node name");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_88.pre.condition = All;
  local_88.pre.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.pre.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_88.pre.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_88.pre.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_88._28_8_ = 0;
  local_88.post.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.post.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.post.fields.
  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = std::
             vector<Style::ConditionalConstraint,_std::allocator<Style::ConditionalConstraint>_>::
             emplace_back<Style::ConditionalConstraint>(&tempConstraint->conditional,&local_88);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_88.post.fields);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_88.pre.fields);
  pxVar4 = node->m_first_node;
  if (pxVar4 != (xml_node<char> *)0x0) {
    do {
      pcVar5 = (pxVar4->m_first_attribute->super_xml_base<char>).m_value;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,pcVar5,(allocator<char> *)&local_a8);
      iVar2 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar2 == 0) {
        QVar1 = All;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar2 == 0) {
          QVar1 = One;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_88);
          QVar1 = None;
          if (iVar2 != 0) {
            plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar3,"Unexpected result");
            __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
      }
      local_d4 = QVar1;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      for (pxVar6 = pxVar4->m_first_node; pxVar6 != (xml_node<char> *)0x0;
          pxVar6 = pxVar6->m_next_sibling) {
        pcVar5 = (pxVar6->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar5,&local_d5);
        UtfHandler::utf8to16(&local_a8,(UtfHandler *)(anonymous_namespace)::utf,&local_c8);
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string>
                  ((vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                   &local_48,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity * 2 + 2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((pxVar6->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) goto LAB_0018f0ef;
      }
      pcVar5 = (pxVar4->super_xml_base<char>).m_name;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      iVar2 = strcmp(pcVar5 + 4,"antecedent");
      (&local_d0->pre)[iVar2 != 0].condition = local_d4;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::operator=(&(&local_d0->pre)[iVar2 != 0].fields,
                  (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                   *)&local_48);
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                 *)&local_48);
      if ((pointer *)CONCAT44(local_88.pre._4_4_,local_88.pre.condition) !=
          (pointer *)
          ((long)&local_88.pre.fields.
                  super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                  ._M_impl.super__Vector_impl_data + 8U)) {
        operator_delete((undefined1 *)CONCAT44(local_88.pre._4_4_,local_88.pre.condition),
                        CONCAT44(local_88.pre.fields.
                                 super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_88.pre.fields.
                                 super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_) + 1);
      }
      if ((pxVar4->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
LAB_0018f0ef:
        __assert_fail("this->m_parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidxml-1.13/rapidxml.hpp"
                      ,0x3ee,
                      "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                     );
      }
      pxVar4 = pxVar4->m_next_sibling;
    } while (pxVar4 != (xml_node<char> *)0x0);
  }
  return;
}

Assistant:

void extractConditionalConstraint (TempConstraintData &tempConstraint, xml_node<> *node) {
    EXPECT_NAME(node, "bcf:constraint");
    ConditionalConstraint &conditional = tempConstraint.conditional.emplace_back(ConditionalConstraint {});

    for (xml_node<> *child = node->first_node(); child; child = child->next_sibling()) {
        string attrVal = child->first_attribute()->value(); // TODO: Check and don't segfault on this

        ConditionalConstraint::Quant quant;

        if (attrVal == "all") {
            quant = ConditionalConstraint::Quant::All;
        } else if (attrVal == "one") {
            quant = ConditionalConstraint::Quant::One;
        } else {
            ASSERT(attrVal == "none");
            quant = ConditionalConstraint::Quant::None;
        }

        vector<u16string> fields {};

        for (xml_node<> *field = child->first_node(); field; field = field->next_sibling()) {
            fields.emplace_back(utf.utf8to16(field->value()));
        }

        const char *name = child->name();
        if (IS("antecedent")) {
            conditional.pre.condition = quant;
            conditional.pre.fields = fields;
        } else {
            conditional.post.condition = quant;
            conditional.post.fields = fields;
        }
    }
}